

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxNamespace findNamespace(plist *pl,constUtf8 uri)

{
  long lVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  genxNamespace *nn;
  int i;
  int local_1c;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 8) <= local_1c) {
      return (genxNamespace)0x0;
    }
    iVar2 = strcmp(in_RSI,*(char **)(*(long *)(lVar1 + (long)local_1c * 8) + 8));
    if (iVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  return *(genxNamespace *)(lVar1 + (long)local_1c * 8);
}

Assistant:

static genxNamespace findNamespace(plist * pl, constUtf8 uri)
{
  int i;
  genxNamespace * nn = (genxNamespace *) pl->pointers;

  for (i = 0; i < pl->count; i++)
    if (strcmp((char *) uri, (const char *) nn[i]->name) == 0)
      return nn[i];

  return NULL;
}